

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::StoreLastParsedElement::operator()
          (StoreLastParsedElement *this,iterator_t *str,iterator_t *end)

{
  ParserDPOMDPFormat_Spirit *pPVar1;
  allocator<char> local_101;
  long *local_100 [2];
  long local_f0 [2];
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_e0;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  local_78;
  
  pPVar1 = this->_m_po;
  (pPVar1->_m_lp_string)._M_string_length = 0;
  *(pPVar1->_m_lp_string)._M_dataplus._M_p = '\0';
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_78,str);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(&local_e0,end);
  std::__cxx11::string::
  string<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,void>
            ((string *)local_100,&local_78,&local_e0,&local_101);
  std::__cxx11::string::operator=((string *)&this->_m_po->_m_lp_string,(string *)local_100);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p !=
      &local_e0._pos.
       super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .file.field_2) {
    operator_delete(local_e0._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_e0._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_e0._end.super_type.m_iterator.m_mem.pn);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_e0.super_type.m_iterator.super_type.m_iterator.m_mem + 8)
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._pos.
         super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .file._M_dataplus._M_p !=
      &local_78._pos.
       super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .file.field_2) {
    operator_delete(local_78._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file._M_dataplus._M_p,
                    local_78._pos.
                    super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .file.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_78._end.super_type.m_iterator.m_mem.pn);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&local_78.super_type.m_iterator.super_type.m_iterator.m_mem + 8)
            );
  this->_m_po->_m_lp_type = STRING;
  return;
}

Assistant:

void ParserDPOMDPFormat_Spirit::StoreLastParsedElement::operator()(iterator_t str, iterator_t end) const
{ 
    _m_po->_m_lp_string.clear();
    _m_po->_m_lp_string = string(str, end);
    if(DEBUG_PARSE) cout << "Stored Last Parsed: string "<<
        _m_po->_m_lp_string << endl;
    _m_po->_m_lp_type = STRING;
}